

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

int t_pool_add_result(t_pool_job *j,void *data)

{
  t_results_queue *ptVar1;
  t_res *ptVar2;
  t_pool_result *r;
  t_results_queue *q;
  void *data_local;
  t_pool_job *j_local;
  
  ptVar1 = j->q;
  if (ptVar1 == (t_results_queue *)0x0) {
    j_local._4_4_ = 0;
  }
  else {
    ptVar2 = (t_res *)malloc(0x18);
    if (ptVar2 == (t_res *)0x0) {
      j_local._4_4_ = -1;
    }
    else {
      ptVar2->next = (t_res *)0x0;
      ptVar2->data = data;
      ptVar2->serial = j->serial;
      pthread_mutex_lock((pthread_mutex_t *)&ptVar1->result_m);
      if (ptVar1->result_tail == (t_pool_result *)0x0) {
        ptVar1->result_tail = ptVar2;
        ptVar1->result_head = ptVar2;
      }
      else {
        ptVar1->result_tail->next = ptVar2;
        ptVar1->result_tail = ptVar2;
      }
      ptVar1->queue_len = ptVar1->queue_len + 1;
      ptVar1->pending = ptVar1->pending + -1;
      pthread_cond_signal((pthread_cond_t *)&ptVar1->result_avail_c);
      pthread_mutex_unlock((pthread_mutex_t *)&ptVar1->result_m);
      j_local._4_4_ = 0;
    }
  }
  return j_local._4_4_;
}

Assistant:

static int t_pool_add_result(t_pool_job *j, void *data) {
    t_results_queue *q = j->q;
    t_pool_result *r;

#ifdef DEBUG
    fprintf(stderr, "%d: Adding resulting to queue %p, serial %d\n",
	    worker_id(j->p), q, j->serial);
#endif

    /* No results queue is fine if we don't want any results back */
    if (!q)
	return 0;

    if (!(r = malloc(sizeof(*r))))
	return -1;

    r->next = NULL;
    r->data = data;
    r->serial = j->serial;

    pthread_mutex_lock(&q->result_m);
    if (q->result_tail) {
	q->result_tail->next = r;
	q->result_tail = r;
    } else {
	q->result_head = q->result_tail = r;
    }
    q->queue_len++;
    q->pending--;

#ifdef DEBUG
    fprintf(stderr, "%d: Broadcasting result_avail (id %d)\n",
	    worker_id(j->p), r->serial);
#endif
    pthread_cond_signal(&q->result_avail_c);
#ifdef DEBUG
    fprintf(stderr, "%d: Broadcast complete\n", worker_id(j->p));
#endif

    pthread_mutex_unlock(&q->result_m);

    return 0;
}